

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testtool.c
# Opt level: O0

int find_package_from_name(char *packname,int len)

{
  LispPTR LVar1;
  LispPTR *pLVar2;
  LispPTR *pLVar3;
  arrayheader *pi_array;
  char *pname;
  DLword len2;
  NEWSTRINGP *namestring;
  PACKAGE *package;
  int index;
  int len_local;
  char *packname_local;
  
  pLVar2 = NativeAligned4FromLAddr(*Package_from_Index_word);
  package._0_4_ = 1;
  while( true ) {
    if ((int)pLVar2[2] <= (int)package) {
      return -1;
    }
    LVar1 = aref1(*Package_from_Index_word,(int)package);
    pLVar3 = NativeAligned4FromLAddr(LVar1);
    pLVar3 = NativeAligned4FromLAddr(pLVar3[2]);
    pi_array = (arrayheader *)NativeAligned2FromLAddr(*pLVar3 & 0xfffffff);
    if ((short)pLVar3[1] != 0) {
      pi_array = (arrayheader *)((long)&pi_array->field_0x0 + (long)(int)(uint)(ushort)pLVar3[1]);
    }
    if ((len == (pLVar3[2] & 0xffff)) &&
       (LVar1 = compare_chars((char *)pi_array,packname,(DLword)len), LVar1 == 1)) break;
    package._0_4_ = (int)package + 1;
  }
  return (int)package;
}

Assistant:

int find_package_from_name(const char *packname, int len) {
  int index;
  PACKAGE *package;
  NEWSTRINGP *namestring;
  DLword len2;
  char *pname;
  struct arrayheader *pi_array;

  /* assumes the *PACKAGE-FROM-INDEX* array is simple with no offset */
  pi_array = (struct arrayheader *)NativeAligned4FromLAddr(*Package_from_Index_word);
  for (index = 1; index < pi_array->totalsize; index++) {
    package = (PACKAGE *)NativeAligned4FromLAddr(aref1(*Package_from_Index_word, index));
    namestring = (NEWSTRINGP *)NativeAligned4FromLAddr(package->NAME);
    pname = (char *)NativeAligned2FromLAddr(namestring->base);
    if (namestring->offset != 0) { pname += namestring->offset; }

    len2 = (DLword)(namestring->fillpointer);
    if (len == len2) {
      if (compare_chars(pname, packname, len) == T) { return (index); }
    }
  } /* for end */
  return (-1);
}